

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

void uv__print_handles(uv_loop_t *loop,int only_active,FILE *stream)

{
  uint uVar1;
  undefined8 *puVar2;
  char *pcVar3;
  
  if ((loop == (uv_loop_t *)0x0) && (loop = default_loop_ptr, default_loop_ptr == (uv_loop_t *)0x0))
  {
    loop = &default_loop_struct;
    uv_loop_init(&default_loop_struct);
    default_loop_ptr = &default_loop_struct;
  }
  for (puVar2 = (undefined8 *)loop->handle_queue[0]; (void **)puVar2 != loop->handle_queue;
      puVar2 = (undefined8 *)*puVar2) {
    if ((only_active == 0) || ((*(byte *)(puVar2 + 7) & 4) != 0)) {
      pcVar3 = "<unknown>";
      if (*(int *)(puVar2 + -2) - 1U < 0x10) {
        pcVar3 = &DAT_00273980 + *(int *)(&DAT_00273980 + (ulong)(*(int *)(puVar2 + -2) - 1U) * 4);
      }
      uVar1 = *(uint *)(puVar2 + 7);
      fprintf((FILE *)stream,"[%c%c%c] %-8s %p\n",(ulong)(uint)(int)"R-"[(uVar1 & 8) == 0],
              (ulong)(uint)(int)"A-"[(uVar1 & 4) == 0],(ulong)(uint)(int)"I-"[(uVar1 & 0x10) == 0],
              pcVar3,puVar2 + -4);
    }
  }
  return;
}

Assistant:

static void uv__print_handles(uv_loop_t* loop, int only_active, FILE* stream) {
  const char* type;
  QUEUE* q;
  uv_handle_t* h;

  if (loop == NULL)
    loop = uv_default_loop();

  QUEUE_FOREACH(q, &loop->handle_queue) {
    h = QUEUE_DATA(q, uv_handle_t, handle_queue);

    if (only_active && !uv__is_active(h))
      continue;

    switch (h->type) {
#define X(uc, lc) case UV_##uc: type = #lc; break;
      UV_HANDLE_TYPE_MAP(X)
#undef X
      default: type = "<unknown>";
    }

    fprintf(stream,
            "[%c%c%c] %-8s %p\n",
            "R-"[!(h->flags & UV_HANDLE_REF)],
            "A-"[!(h->flags & UV_HANDLE_ACTIVE)],
            "I-"[!(h->flags & UV_HANDLE_INTERNAL)],
            type,
            (void*)h);
  }
}